

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_is_unsigned_asn1_integer(CBS *cbs)

{
  byte bVar1;
  byte bVar2;
  uint in_EAX;
  bool bVar3;
  
  if (cbs->len == 0) {
    bVar3 = false;
  }
  else {
    bVar1 = *cbs->data;
    in_EAX = (uint)(bVar1 >> 7);
    bVar3 = true;
    if (cbs->len != 1) {
      bVar2 = cbs->data[1];
      if (bVar1 == 0 && -1 < (char)bVar2) {
        bVar3 = false;
      }
      else {
        bVar3 = bVar1 != 0xff || -1 < (char)bVar2;
      }
    }
  }
  return (int)(byte)(in_EAX == 0 & bVar3);
}

Assistant:

int CBS_is_valid_asn1_integer(const CBS *cbs, int *out_is_negative) {
  CBS copy = *cbs;
  uint8_t first_byte, second_byte;
  if (!CBS_get_u8(&copy, &first_byte)) {
    return 0;  // INTEGERs may not be empty.
  }
  if (out_is_negative != NULL) {
    *out_is_negative = (first_byte & 0x80) != 0;
  }
  if (!CBS_get_u8(&copy, &second_byte)) {
    return 1;  // One byte INTEGERs are always minimal.
  }
  if ((first_byte == 0x00 && (second_byte & 0x80) == 0) ||
      (first_byte == 0xff && (second_byte & 0x80) != 0)) {
    return 0;  // The value is minimal iff the first 9 bits are not all equal.
  }
  return 1;
}